

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

void Mpm_ObjTranslateCutsFromStore(Mpm_Man_t *p,Mig_Obj_t *pObj)

{
  void *Entry;
  Mig_Obj_t *p_00;
  int iVar1;
  Mpm_Uni_t *local_38;
  int *pList;
  int i;
  Mpm_Uni_t *pUnit;
  Mpm_Cut_t *pCut;
  Mig_Obj_t *pObj_local;
  Mpm_Man_t *p_local;
  
  pUnit = (Mpm_Uni_t *)0x0;
  pCut = (Mpm_Cut_t *)pObj;
  pObj_local = (Mig_Obj_t *)p;
  local_38 = (Mpm_Uni_t *)Mpm_ObjCutListP(p,pObj);
  if (((int)pObj_local[4].pFans[2] < 1) ||
     ((int)pObj_local[1].pFans[1] < (int)pObj_local[4].pFans[2])) {
    __assert_fail("p->nCutStore > 0 && p->nCutStore <= p->nNumCuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                  ,0x228,"void Mpm_ObjTranslateCutsFromStore(Mpm_Man_t *, Mig_Obj_t *)");
  }
  if (local_38->mTime != 0) {
    __assert_fail("*pList == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                  ,0x229,"void Mpm_ObjTranslateCutsFromStore(Mpm_Man_t *, Mig_Obj_t *)");
  }
  for (pList._4_4_ = 0; pList._4_4_ < (int)pObj_local[4].pFans[2]; pList._4_4_ = pList._4_4_ + 1) {
    Entry = *(void **)(pObj_local[5].pFans + (long)pList._4_4_ * 2);
    iVar1 = Mpm_CutCreate((Mpm_Man_t *)pObj_local,(Mpm_Cut_t *)((long)Entry + 0x1c),
                          (Mpm_Cut_t **)&pUnit);
    local_38->mTime = iVar1;
    local_38 = pUnit;
    Vec_PtrPush((Vec_Ptr_t *)(pObj_local + 0xcb),Entry);
  }
  iVar1 = Vec_PtrSize((Vec_Ptr_t *)(pObj_local + 0xcb));
  p_00 = pObj_local;
  if (iVar1 == (int)pObj_local[1].pFans[1] + 1) {
    if ((pObj_local[4].pFans[2] == (Mig_Fan_t)0x1) && ((uint)pUnit->mArea >> 0x1b < 2)) {
      local_38->mTime = 0;
    }
    else {
      iVar1 = Mig_ObjId((Mig_Obj_t *)pCut);
      iVar1 = Mpm_CutCreateUnit((Mpm_Man_t *)p_00,iVar1);
      local_38->mTime = iVar1;
    }
    return;
  }
  __assert_fail("Vec_PtrSize(&p->vFreeUnits) == p->nNumCuts + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                ,0x232,"void Mpm_ObjTranslateCutsFromStore(Mpm_Man_t *, Mig_Obj_t *)");
}

Assistant:

void Mpm_ObjTranslateCutsFromStore( Mpm_Man_t * p, Mig_Obj_t * pObj )
{
    Mpm_Cut_t * pCut = NULL;
    Mpm_Uni_t * pUnit;
    int i, *pList = Mpm_ObjCutListP( p, pObj );
    assert( p->nCutStore > 0 && p->nCutStore <= p->nNumCuts );
    assert( *pList == 0 );
    // translate cuts
    for ( i = 0; i < p->nCutStore; i++ )
    {
        pUnit  = p->pCutStore[i];
        *pList = Mpm_CutCreate( p, &pUnit->pCut, &pCut );
        pList  = &pCut->hNext;
        Vec_PtrPush( &p->vFreeUnits, pUnit );
    }
    assert( Vec_PtrSize(&p->vFreeUnits) == p->nNumCuts + 1 );
    if ( p->nCutStore == 1 && pCut->nLeaves < 2 )
        *pList = 0;
    else
        *pList = Mpm_CutCreateUnit( p, Mig_ObjId(pObj) );
}